

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<BoolView>::copyTo(vec<BoolView> *this,vec<BoolView> *copy)

{
  BoolView *pBVar1;
  BoolView *pBVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  
  clear(copy,false);
  growTo(copy,this->sz);
  lVar3 = 8;
  for (uVar4 = 0; uVar4 < this->sz; uVar4 = uVar4 + 1) {
    pBVar1 = copy->data;
    pBVar2 = this->data;
    *(undefined ***)((long)pBVar1 + lVar3 + -8) = &PTR_finished_001efbb8;
    *(undefined4 *)((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar3) =
         *(undefined4 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar3);
    *(undefined1 *)((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar3 + 4) =
         *(undefined1 *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar3 + 4);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void copyTo(vec<T>& copy) const {
		copy.clear();
		copy.growTo(sz);
		for (unsigned int i = 0; i < sz; i++) {
			new (&copy[i]) T(data[i]);
		}
	}